

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O2

void __thiscall Process::DupFd(Process *this,int from,int to)

{
  iterator iVar1;
  runtime_error *this_00;
  unordered_map<int,_FDInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_FDInfo>_>_>
  *this_01;
  int to_local;
  int from_local;
  FDInfo info;
  string local_38;
  
  this_01 = &this->files_;
  to_local = to;
  from_local = from;
  iVar1 = std::
          _Hashtable<int,_std::pair<const_int,_FDInfo>,_std::allocator<std::pair<const_int,_FDInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_01->_M_h,&from_local);
  if (iVar1.super__Node_iterator_base<std::pair<const_int,_FDInfo>,_false>._M_cur !=
      (__node_type *)0x0) {
    FDInfo::FDInfo(&info,to,(path *)((long)iVar1.
                                           super__Node_iterator_base<std::pair<const_int,_FDInfo>,_false>
                                           ._M_cur + 0x18),false);
    iVar1 = std::
            _Hashtable<int,_std::pair<const_int,_FDInfo>,_std::allocator<std::pair<const_int,_FDInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_01->_M_h,&to_local);
    if (iVar1.super__Node_iterator_base<std::pair<const_int,_FDInfo>,_false>._M_cur ==
        (__node_type *)0x0) {
      std::
      _Hashtable<int,std::pair<int_const,FDInfo>,std::allocator<std::pair<int_const,FDInfo>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<int&,FDInfo&>
                ((_Hashtable<int,std::pair<int_const,FDInfo>,std::allocator<std::pair<int_const,FDInfo>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)this_01,&to_local,&info);
    }
    else {
      FDInfo::operator=((FDInfo *)
                        ((long)iVar1.super__Node_iterator_base<std::pair<const_int,_FDInfo>,_false>.
                               _M_cur + 0x10),&info);
    }
    FDInfo::~FDInfo(&info);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_38,from_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                 "Unknown file descriptor: ",&local_38);
  std::runtime_error::runtime_error(this_00,(string *)&info);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Process::DupFd(int from, int to)
{
  auto it = files_.find(from);
  if (it == files_.end()) {
    throw std::runtime_error(
        "Unknown file descriptor: " + std::to_string(from)
    );
  }

  const auto &oldInfo = it->second;
  FDInfo info(to, oldInfo.Path, false);

  auto jt = files_.find(to);
  if (jt == files_.end()) {
    files_.emplace(to, info);
  } else {
    jt->second = info;
  }
}